

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

AtanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_atanh(NeuralNetworkLayer *this)

{
  ulong uVar1;
  AtanhLayerParams *pAVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x30c) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x30c;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pAVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::AtanhLayerParams>
                       (arena);
    (this->layer_).atanh_ = pAVar2;
  }
  return (AtanhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AtanhLayerParams* NeuralNetworkLayer::_internal_mutable_atanh() {
  if (!_internal_has_atanh()) {
    clear_layer();
    set_has_atanh();
    layer_.atanh_ = CreateMaybeMessage< ::CoreML::Specification::AtanhLayerParams >(GetArenaForAllocation());
  }
  return layer_.atanh_;
}